

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsCheckHeader.cxx
# Opt level: O3

bool __thiscall
kws::Parser::CheckHeader(Parser *this,char *filename,bool considerSpaceEOL,bool useCVS)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  Status SVar7;
  unsigned_long uVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  pointer pcVar11;
  pointer pcVar12;
  long lVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined7 in_register_00000009;
  char *pcVar14;
  undefined7 in_register_00000011;
  uint uVar15;
  ulong uVar16;
  _Alloc_hider _Var17;
  pointer pbVar18;
  char cVar19;
  pointer pvVar20;
  int iVar21;
  byte bVar23;
  pointer pcVar24;
  pointer __x;
  ulong uVar25;
  value_type *__x_00;
  bool bVar26;
  string fullpath;
  string wordh;
  string file;
  string word;
  Directory directory;
  string headerFilename;
  ErrorVectorType tempErrorVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  fileNames;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  tempErrors;
  string dirname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  uint local_374;
  pointer local_370;
  pointer local_368;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_360;
  undefined1 local_340 [24];
  char local_328 [8];
  size_type local_320;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  undefined8 local_308;
  string *local_300;
  char *local_2f8;
  char *local_2f0;
  char local_2e8 [16];
  Directory local_2d8;
  value_type local_2d0;
  undefined4 local_2ac;
  vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_> local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  string *local_268;
  pointer local_260;
  vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
  local_258;
  pointer local_240;
  string local_238 [16];
  int iVar22;
  
  local_374 = (uint)CONCAT71(in_register_00000009,useCVS);
  local_2ac = (undefined4)CONCAT71(in_register_00000011,considerSpaceEOL);
  this->m_TestsDone[0xd] = true;
  pcVar4 = (char *)operator_new__(0xff);
  builtin_strncpy(pcVar4,"The header should respect the template",0x27);
  pcVar9 = (char *)this->m_TestsDescription[0xd]._M_string_length;
  strlen(pcVar4);
  std::__cxx11::string::_M_replace((ulong)(this->m_TestsDescription + 0xd),0,pcVar9,(ulong)pcVar4);
  operator_delete__(pcVar4);
  if (filename == (char *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "CheckHeader(): Please specify an header file or a directory containing headers",0x4e
              );
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
    bVar23 = 0;
  }
  else {
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
    sVar5 = strlen(filename);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,filename,filename + sVar5);
    lVar6 = std::__cxx11::string::find((char)&local_2d0,0x20);
    if ((lVar6 == -1) &&
       (std::__cxx11::string::_M_replace
                  ((ulong)&local_2d0,0,(char *)local_2d0._M_string_length,0x169503),
       *filename != '\0')) {
      uVar16 = 0;
      do {
        if (filename[uVar16] != '\"') {
          std::__cxx11::string::push_back((char)&local_2d0);
        }
        uVar16 = uVar16 + 1;
        sVar5 = strlen(filename);
      } while (uVar16 < sVar5);
    }
    if (*local_2d0._M_dataplus._M_p == '\"') {
      std::__cxx11::string::substr((ulong)local_238,(ulong)&local_2d0);
      std::__cxx11::string::operator=((string *)&local_2d0,(string *)local_238);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p);
      }
    }
    kwssys::Directory::Directory(&local_2d8);
    std::__cxx11::string::string
              ((string *)local_238,local_2d0._M_dataplus._M_p,(allocator *)local_340);
    SVar7 = kwssys::Directory::Load(&local_2d8,local_238,(string *)0x0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
      operator_delete(local_238[0]._M_dataplus._M_p);
    }
    if (SVar7.Kind_ == Success) {
      local_238[0]._M_dataplus._M_p = (pointer)&local_238[0].field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_238,local_2d0._M_dataplus._M_p,
                 (char *)(local_2d0._M_string_length + (long)local_2d0._M_dataplus._M_p));
      if (local_238[0]._M_dataplus._M_p[local_238[0]._M_string_length - 1] != '/') {
        std::__cxx11::string::append((char *)local_238);
      }
      uVar15 = 0;
      while( true ) {
        uVar8 = kwssys::Directory::GetNumberOfFiles(&local_2d8);
        if (uVar8 <= uVar15) break;
        pcVar9 = kwssys::Directory::GetFile(&local_2d8,(ulong)uVar15);
        std::__cxx11::string::string((string *)local_340,pcVar9,(allocator *)&local_398);
        std::operator+(&local_398,local_238,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_340);
        iVar3 = std::__cxx11::string::compare((char *)local_340);
        if ((((iVar3 != 0) && (iVar3 = std::__cxx11::string::compare((char *)local_340), iVar3 != 0)
             ) && (iVar3 = std::__cxx11::string::compare((char *)local_340), iVar3 != 0)) &&
           (iVar3 = std::__cxx11::string::compare((char *)local_340), iVar3 != 0)) {
          std::operator+(&local_360,local_238,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_340);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288
                     ,&local_360);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_360._M_dataplus._M_p != &local_360.field_2) {
            operator_delete(local_360._M_dataplus._M_p);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_398._M_dataplus._M_p != &local_398.field_2) {
          operator_delete(local_398._M_dataplus._M_p);
        }
        if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
          operator_delete((void *)local_340._0_8_);
        }
        uVar15 = uVar15 + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238[0]._M_dataplus._M_p != &local_238[0].field_2) {
        operator_delete(local_238[0]._M_dataplus._M_p);
      }
    }
    else {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&local_288,&local_2d0);
    }
    local_258.
    super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.
    super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_300 = &this->m_Buffer;
    local_268 = (string *)&this->m_HeaderFilename;
    local_374 = local_374 ^ 1;
    pbVar18 = local_288.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::ifstream::ifstream(local_238);
      std::ifstream::open((char *)local_238,(_Ios_Openmode)(pbVar18->_M_dataplus)._M_p);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Cannot open header file: ",0x19);
        pcVar9 = (pbVar18->_M_dataplus)._M_p;
        if (pcVar9 == (char *)0x0) {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x197368);
        }
        else {
          sVar5 = strlen(pcVar9);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar9,sVar5);
        }
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
        std::ifstream::~ifstream(local_238);
        bVar23 = 0;
        goto LAB_0014b1e6;
      }
      std::istream::seekg((long)local_238,_S_beg);
      lVar6 = std::istream::tellg();
      std::istream::seekg((long)local_238,_S_beg);
      pcVar9 = (char *)operator_new__(lVar6 + 1);
      std::istream::read((char *)local_238,(long)pcVar9);
      pcVar9[lVar6] = '\0';
      local_398._M_dataplus._M_p = (pointer)&local_398.field_2;
      sVar5 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_398,pcVar9,pcVar9 + sVar5);
      std::__cxx11::string::resize((ulong)&local_398,(char)lVar6);
      std::ifstream::close();
      operator_delete__(pcVar9);
      ConvertBufferToWindowsFileType(this,&local_398);
      local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
      super__Vector_impl_data._M_start = (value_type *)0x0;
      local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
      super__Vector_impl_data._M_finish = (value_type *)0x0;
      local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pcVar4 = (local_300->_M_dataplus)._M_p;
      uVar15 = 0;
      pcVar9 = pcVar4;
      local_260 = pbVar18;
      if (local_398._M_string_length != 0) {
        paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_398._M_dataplus._M_p + local_398._M_string_length);
        local_308 = (ulong)local_308._4_4_ << 0x20;
        pcVar24 = (pointer)0x0;
        _Var17._M_p = local_398._M_dataplus._M_p;
        pcVar11 = (pointer)0xffffffffffffffff;
LAB_0014a7b5:
        local_370 = pcVar11;
        pcVar4 = (this->m_Buffer)._M_dataplus._M_p;
        pcVar14 = pcVar4 + (this->m_Buffer)._M_string_length;
        if (pcVar9 != pcVar14) {
          cVar2 = *_Var17._M_p;
          if (cVar2 == '$' && (char)local_374 == '\0') {
            do {
              _Var17._M_p = _Var17._M_p + 1;
              pcVar24 = (pointer)(ulong)((int)pcVar24 + 1);
              cVar2 = *_Var17._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var17._M_p == paVar10) break;
            } while (cVar2 != '$');
            do {
              pcVar9 = pcVar9 + 1;
              uVar15 = uVar15 + 1;
              cVar19 = *pcVar9;
              if (pcVar9 == pcVar14) break;
            } while (cVar19 != '$');
          }
          else {
            cVar19 = *pcVar9;
          }
          iVar3 = (int)pcVar24;
          pcVar11 = local_370;
          if (cVar19 == cVar2) goto LAB_0014aee7;
          if (cVar2 != '<') {
            if ((char)local_2ac == '\0') {
              pcVar4 = pcVar9;
              if (cVar2 == ' ') {
                paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)_Var17._M_p;
                if (cVar19 == ' ') {
joined_r0x0014a8e8:
                  for (; pcVar4 != pcVar14; pcVar4 = pcVar4 + 1) {
                    cVar2 = *pcVar4;
                    if (cVar2 != ' ') goto LAB_0014a906;
                  }
                }
                else {
                  for (; paVar1 != paVar10;
                      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)(paVar1->_M_local_buf + 1)) {
                    cVar2 = paVar1->_M_local_buf[0];
                    if (cVar2 != ' ') goto LAB_0014a906;
                  }
                }
              }
              else if (cVar19 == ' ') goto joined_r0x0014a8e8;
            }
            goto LAB_0014aa1d;
          }
          local_368 = (pointer)std::__cxx11::string::find
                                         ((char *)&local_398,0x1761ab,(ulong)pcVar24);
          pcVar11 = (pointer)std::__cxx11::string::find((char *)&local_398,0x1761b0,(ulong)pcVar24);
          if (pcVar11 == pcVar24) {
            if (*_Var17._M_p != '\n') {
              do {
                if (_Var17._M_p == local_398._M_dataplus._M_p + local_398._M_string_length) break;
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(_Var17._M_p + 1);
                pcVar24 = (pointer)(ulong)((int)pcVar24 + 1);
                pcVar4 = _Var17._M_p + 1;
                _Var17._M_p = (pointer)paVar10;
              } while (*pcVar4 != '\n');
            }
            if (*pcVar9 != '\n') {
              pcVar4 = pcVar9;
              do {
                pcVar9 = pcVar4;
                if (pcVar4 == (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length)
                break;
                uVar15 = uVar15 + 1;
                pcVar9 = pcVar4 + 1;
                pcVar14 = pcVar4 + 1;
                pcVar4 = pcVar9;
              } while (*pcVar14 != '\n');
            }
          }
          else {
            if (local_368 != pcVar24) goto LAB_0014aa1d;
            if (*_Var17._M_p != ' ') {
              do {
                if (_Var17._M_p == local_398._M_dataplus._M_p + local_398._M_string_length) break;
                paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(_Var17._M_p + 1);
                pcVar24 = (pointer)(ulong)((int)pcVar24 + 1);
                pcVar4 = _Var17._M_p + 1;
                _Var17._M_p = (pointer)paVar10;
              } while (*pcVar4 != ' ');
            }
            if (*pcVar9 != ' ') {
              pcVar4 = pcVar9;
              do {
                pcVar9 = pcVar4;
                if (pcVar4 == (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length)
                break;
                uVar15 = uVar15 + 1;
                pcVar9 = pcVar4 + 1;
                pcVar14 = pcVar4 + 1;
                pcVar4 = pcVar9;
              } while (*pcVar14 != ' ');
            }
          }
          goto LAB_0014a9ec;
        }
        goto LAB_0014af50;
      }
      local_308 = (ulong)local_308._4_4_ << 0x20;
LAB_0014af50:
      pbVar18 = local_260;
      if (pcVar9 == pcVar4 + (this->m_Buffer)._M_string_length) {
        local_328 = (char  [8])&local_318;
        local_320 = 0;
        local_318._M_local_buf[0] = '\0';
        local_340._0_8_ = (pointer)0x1;
        local_340._8_8_ = (pointer)0x1;
        local_340._16_8_ = 0xd;
        std::__cxx11::string::_M_replace((ulong)local_328,0,(char *)0x0,0x1761f9);
        pbVar18 = local_260;
        std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                  (&local_2a8,(value_type *)local_340);
        if (local_328 != (char  [8])&local_318) {
          operator_delete((void *)local_328);
        }
        bVar23 = 1;
LAB_0014b04f:
        std::
        vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
        ::push_back(&local_258,&local_2a8);
        pbVar18 = pbVar18 + 1;
        bVar26 = true;
      }
      else {
        bVar23 = (byte)local_308;
        if ((local_308 & 1) != 0) goto LAB_0014b04f;
        std::__cxx11::string::_M_assign(local_268);
        for (__x = local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                   ._M_impl.super__Vector_impl_data._M_start;
            __x != local_2a8.super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                   ._M_impl.super__Vector_impl_data._M_finish; __x = __x + 1) {
          std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                    (&this->m_ErrorList,__x);
        }
        bVar26 = false;
      }
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::~vector(&local_2a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_398._M_dataplus._M_p != &local_398.field_2) {
        operator_delete(local_398._M_dataplus._M_p);
      }
      std::ifstream::~ifstream(local_238);
      if (!bVar26) {
        bVar23 = 1;
        goto LAB_0014b1e6;
      }
    } while (pbVar18 !=
             local_288.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
    uVar25 = 0;
    uVar16 = uVar25;
    if (local_258.
        super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_258.
        super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      iVar3 = 9999999;
      uVar16 = 0;
      pvVar20 = local_258.
                super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        iVar22 = (int)((ulong)((long)(pvVar20->
                                     super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                              (long)(pvVar20->
                                    super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>
                                    )._M_impl.super__Vector_impl_data._M_start) >> 3);
        iVar21 = iVar22 * -0x49249249;
        bVar26 = iVar3 + iVar22 * 0x49249249 < 0;
        if (iVar3 != iVar21 && SBORROW4(iVar3,iVar21) == bVar26) {
          uVar16 = uVar25;
        }
        if (SBORROW4(iVar3,iVar21) == bVar26) {
          iVar3 = iVar21;
        }
        uVar25 = (ulong)((int)uVar25 + 1);
        pvVar20 = pvVar20 + 1;
      } while (pvVar20 !=
               local_258.
               super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    for (__x_00 = local_258.
                  super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                  super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                  super__Vector_impl_data._M_start;
        __x_00 != local_258.
                  super__Vector_base<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar16].
                  super__Vector_base<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>._M_impl.
                  super__Vector_impl_data._M_finish; __x_00 = __x_00 + 1) {
      std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
                (&this->m_ErrorList,__x_00);
    }
    std::__cxx11::string::_M_assign(local_268);
    bVar23 = bVar23 ^ 1;
LAB_0014b1e6:
    std::
    vector<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>,_std::allocator<std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>_>_>
    ::~vector(&local_258);
    kwssys::Directory::~Directory(&local_2d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0._M_dataplus._M_p != &local_2d0.field_2) {
      operator_delete(local_2d0._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_288);
  }
  return (bool)(bVar23 & 1);
LAB_0014a906:
  if (cVar2 != '\n') {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p != paVar10) {
      iVar21 = (int)_Var17._M_p;
      do {
        if (*_Var17._M_p == '\n') goto LAB_0014aa0a;
        _Var17._M_p = _Var17._M_p + 1;
        pcVar24 = (pointer)(ulong)((int)pcVar24 + 1);
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)_Var17._M_p != paVar10);
      pcVar24 = (pointer)(ulong)(uint)(((int)paVar10 + iVar3) - iVar21);
      _Var17._M_p = (pointer)paVar10;
    }
LAB_0014aa0a:
    for (; (pcVar9 != pcVar14 && (*pcVar9 != '\n')); pcVar9 = pcVar9 + 1) {
      uVar15 = uVar15 + 1;
    }
LAB_0014a9ec:
    paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_398._M_dataplus._M_p + local_398._M_string_length);
    pcVar11 = local_370;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var17._M_p == paVar10) {
      pcVar4 = (local_300->_M_dataplus)._M_p;
      goto LAB_0014af50;
    }
    goto LAB_0014a7b5;
  }
LAB_0014aa1d:
  local_368 = (pointer)(ulong)uVar15;
  pcVar12 = (pointer)GetLineNumber(this,(size_t)local_368,false);
  pcVar11 = local_370;
  if (pcVar12 == local_370) goto LAB_0014aee7;
  local_370 = pcVar24;
  local_240 = pcVar12;
  lVar6 = std::__cxx11::string::find((char)&local_398,0x20);
  lVar13 = std::__cxx11::string::find((char)&local_398,10);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_360,"");
  local_308 = lVar13;
  if (lVar6 < lVar13 && lVar6 != -1) {
    std::__cxx11::string::substr((ulong)local_340,(ulong)&local_398);
LAB_0014ab04:
    std::__cxx11::string::operator=((string *)&local_360,(string *)local_340);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  else if (lVar13 != -1) {
    std::__cxx11::string::substr((ulong)local_340,(ulong)&local_398);
    goto LAB_0014ab04;
  }
  cVar2 = (char)local_300;
  lVar6 = std::__cxx11::string::find(cVar2,0x20);
  lVar13 = std::__cxx11::string::find(cVar2,10);
  local_2f8 = local_2e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f8);
  if (lVar6 < lVar13 && lVar6 != -1) {
    std::__cxx11::string::substr((ulong)local_340,(ulong)local_300);
LAB_0014abf0:
    std::__cxx11::string::operator=((string *)&local_2f8,(string *)local_340);
    if ((undefined1 *)local_340._0_8_ != local_340 + 0x10) {
      operator_delete((void *)local_340._0_8_);
    }
  }
  else if (local_308 != -1) {
    std::__cxx11::string::substr((ulong)local_340,(ulong)local_300);
    goto LAB_0014abf0;
  }
  pcVar4 = local_2f0;
  if ((local_2f0 == (char *)local_360._M_string_length) &&
     ((local_2f0 == (char *)0x0 ||
      (iVar3 = bcmp(local_2f8,local_360._M_dataplus._M_p,(size_t)local_2f0), iVar3 == 0)))) {
    std::__cxx11::string::_M_replace((ulong)&local_360,0,pcVar4,0x1761b6);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_2f8,0,local_2f0,0x1761c2);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_360);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_360,0,(char *)local_360._M_string_length,0x1761c2);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_2f8);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace((ulong)&local_2f8,0,local_2f0,0x1761ca);
  }
  iVar3 = std::__cxx11::string::compare((char *)&local_360);
  if (iVar3 == 0) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_360,0,(char *)local_360._M_string_length,0x1761ca);
  }
  if (*local_2f8 == '\0') {
    std::__cxx11::string::_M_replace((ulong)&local_2f8,0,local_2f0,0x1761d8);
  }
  if (*local_360._M_dataplus._M_p == '\0') {
    std::__cxx11::string::_M_replace
              ((ulong)&local_360,0,(char *)local_360._M_string_length,0x1761d8);
  }
  pcVar11 = local_240;
  local_328 = (char  [8])&local_318;
  local_320 = 0;
  local_318._M_local_buf[0] = '\0';
  local_340._0_8_ = local_240;
  local_340._8_8_ = local_240;
  local_340._16_8_ = 0xd;
  std::__cxx11::string::_M_replace((ulong)local_328,0,(char *)0x0,0x1761e2);
  std::__cxx11::string::_M_append(local_328,(ulong)local_2f8);
  std::__cxx11::string::append(local_328);
  std::__cxx11::string::_M_append(local_328,(ulong)local_360._M_dataplus._M_p);
  std::__cxx11::string::append(local_328);
  std::__cxx11::string::append(local_328);
  std::vector<kws::ErrorStruct,_std::allocator<kws::ErrorStruct>_>::push_back
            (&local_2a8,(value_type *)local_340);
  for (; (iVar3 = (int)pcVar24,
         _Var17._M_p != local_398._M_dataplus._M_p + local_398._M_string_length &&
         (*_Var17._M_p != '\n')); _Var17._M_p = _Var17._M_p + 1) {
    pcVar24 = (pointer)(ulong)(iVar3 + 1);
  }
  for (; (pcVar9 != (this->m_Buffer)._M_dataplus._M_p + (this->m_Buffer)._M_string_length &&
         (*pcVar9 != '\n')); pcVar9 = pcVar9 + 1) {
    uVar15 = uVar15 + 1;
  }
  if (local_328 != (char  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  if (local_2f8 != local_2e8) {
    operator_delete(local_2f8);
  }
  paVar10 = &local_360.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != paVar10) {
    operator_delete(local_360._M_dataplus._M_p);
    paVar10 = extraout_RAX;
  }
  local_308 = CONCAT44(local_308._4_4_,(int)CONCAT71((int7)((ulong)paVar10 >> 8),1));
LAB_0014aee7:
  paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_398._M_dataplus._M_p + local_398._M_string_length);
  bVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)_Var17._M_p != paVar10;
  _Var17._M_p = _Var17._M_p + bVar26;
  pcVar24 = (pointer)(ulong)(iVar3 + (uint)bVar26);
  pcVar4 = (this->m_Buffer)._M_dataplus._M_p;
  bVar26 = pcVar9 != pcVar4 + (this->m_Buffer)._M_string_length;
  pcVar9 = pcVar9 + bVar26;
  uVar15 = uVar15 + bVar26;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var17._M_p == paVar10) goto LAB_0014af50;
  goto LAB_0014a7b5;
}

Assistant:

bool Parser::CheckHeader(const char* filename, bool considerSpaceEOL,bool useCVS)
{
  m_TestsDone[HEADER] = true;
  constexpr size_t length = 255;
  char* val = new char[length];
  snprintf(val,length,"The header should respect the template");
  m_TestsDescription[HEADER] = val;
  delete [] val;

  bool hasError = false;
  if(!filename)
    {
    std::cout << "CheckHeader(): Please specify an header file or a directory containing headers" << std::endl;
    return false;
    }

  std::vector<std::string> fileNames;
  
  // if there is no space in the name (i.e on linux) we remove the
  // '"' if any. 
  std::string headerFilename = filename;
  if(headerFilename.find(' ') == std::string::npos)
    {
    headerFilename = "";
    for(unsigned long j=0;j<strlen(filename);j++)
      {
      if(filename[j] != '\"')
        {
        headerFilename+=filename[j];
        }
      }
    }

  // Remove quotes if any on linux
  #ifndef WIN32
    if(headerFilename[0] == '"')
      {
      headerFilename = headerFilename.substr(1,headerFilename.size()-2);
      }
  #endif

  // Check if we have a directory or header
  kwssys::Directory directory;
  if(directory.Load(headerFilename.c_str()))
    {
    std::string dirname = headerFilename;
    if(dirname[dirname.size()-1] != '/')
      {
      dirname += "/";
      }

    for(unsigned int i=0;i<directory.GetNumberOfFiles();i++)
      {
      std::string file = directory.GetFile(i);
      std::string fullpath = dirname+file;
      
      if(file!=".." && file!="." && file!="CVS"&& file!= ".svn")
        {
        fileNames.push_back(dirname+file);
        }
      }
    }
  else
    {
    fileNames.push_back(headerFilename);
    }

  // Create a temporary vector of errors
  std::vector<ErrorVectorType> tempErrors;

  std::vector<std::string>::const_iterator itFilename = fileNames.begin();  
  while(itFilename != fileNames.end())
    {
    hasError = false;

    // Read the header file
    std::ifstream file;
    file.open((*itFilename).c_str(), std::ios::binary | std::ios::in);
    if(!file.is_open())
      {
      std::cout << "Cannot open header file: " << (*itFilename).c_str() << std::endl;
      return false;
      }

    file.seekg(0,std::ios::end);
    unsigned long fileSize = file.tellg();
    file.seekg(0,std::ios::beg);

    char* buf = new char[fileSize+1];
    file.read(buf,fileSize);
    buf[fileSize] = 0;
    std::string buffer(buf);
    buffer.resize(fileSize);
    file.close();
    delete [] buf;

    this->ConvertBufferToWindowsFileType(buffer);
    
    ErrorVectorType  tempErrorVector;

    // Check the file char by char
    std::string::const_iterator ith = buffer.begin();
    std::string::const_iterator it = m_Buffer.begin();

    unsigned int pos = 0;
    unsigned int posh = 0;
    long line = -1;


    while((ith != buffer.end()) && (it != m_Buffer.end()))
      {
      // if we have cvs
      if((*ith == '$') && useCVS)
        {
        ith++;
        posh++;
        it++;
        pos++;
        while(((*ith) != '$') && (ith != buffer.end()))
          {
          ith++;
          posh++;
          }
        while(((*it) != '$') && (it != m_Buffer.end()))
          {
          pos++;
          it++;
          }
        //continue;
        }
       
      if((*it) != (*ith))
        {
        // Check if we have a <NA> tag
        if((*ith) == '<')
          {
          auto pos2 = static_cast<long int>(buffer.find("<NA>", posh));
          auto pos3 = static_cast<long int>(buffer.find("<NA>\n", posh));

          // We skip the line
          if(pos3 == static_cast<long int>(posh))
            {
            while(((*ith) != '\n') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != '\n') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          // if we have the tag we skip the word
          else if(pos2 == static_cast<long int>(posh))
            {
            while(((*ith) != ' ') && (ith != buffer.end()))
              {
              ith++;
              posh++;
              }
            while(((*it) != ' ') && (it != m_Buffer.end()))
              {
              pos++;
              it++;
              }
            continue;
            }
          }
        // if we should not check the spaces at the end of line
        else if( (!considerSpaceEOL)
          && ((*ith == ' ') || (*it == ' '))
          )
          {
          // search if we are effectively at the end of the line
          bool isAtEnd = true;
          if(*it == ' ')
            {
            std::string::const_iterator ittemp = it;
            while((ittemp != m_Buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }
          else if(*ith == ' ')
            {
            std::string::const_iterator ittemp = ith;
            while((ittemp != buffer.end()) && ((*ittemp) != '\n'))
              {
              if(*ittemp != ' ')
                {
                isAtEnd = false;
                break;
                }
              ittemp++;
              }
            }

          // If we are at the end we skip the line
          if(!isAtEnd)
            {
            while((ith != buffer.end()) && ((*ith) != '\n'))
              {
              ith++;
              posh++;
              }
            while((it != m_Buffer.end()) && ((*it) != '\n'))
              {
              pos++;
              it++;
              }
            continue;
            }
          }

        // Report the error
        //hasError = true;

        // We report the wrong word and the line
        long l = this->GetLineNumber(pos);
        if(l != line)
          {
          line = l;
          // Find the word
          auto poshw = static_cast<long int>(buffer.find(' ', posh));
          auto poshw2 = static_cast<long int>(buffer.find('\n', posh));
          std::string wordh = "";
          if(poshw!= -1 && poshw < poshw2)
            {
            wordh = buffer.substr(posh,poshw-posh);
            }
          else if (poshw2 != -1)
            {
            wordh = buffer.substr(posh,poshw2-posh-1);
            }

          // Find the word
            auto posw = static_cast<long int>(m_Buffer.find(' ', pos));
            auto posw2 = static_cast<long int>(m_Buffer.find('\n', pos));
            std::string word = "";
            if (posw != -1 && posw < posw2) {
              word = m_Buffer.substr(pos, posw - pos);
            }
          else if (poshw2 != -1)
            {
            word = m_Buffer.substr(pos,posw2-pos-1);
            }

          if(word == wordh)
            {
            wordh = "wrong ident";
            }
         
          if(word == " ")
            {
            word = "[space]";
            }
          if(wordh == " ")
            {
            wordh = "[space]";
            }
         if(word == "\r")
            {
            word = "[end of line]";
            }
          if(wordh == "\r")
            {
            wordh = "[end of line]";
            }
          
          if(word[0] == 0)
            {
            word = "[no char]";
            }
          if(wordh[0] == 0)
            {
            wordh = "[no char]";
            }

          Error error;
          error.line = line;
          error.line2 = error.line;
          error.number = HEADER;
          error.description = "Header mismatch: ";
          error.description += word;
          error.description += " (";
          error.description += wordh;
          error.description += ") : ";
          error.description += headerFilename.c_str();
          tempErrorVector.push_back(error);
          hasError = true;

          // We skip that line   
          while((ith != buffer.end()) && ((*ith) != '\n'))
            {
            ith++;
            posh++;
            }
          while((it != m_Buffer.end()) && ((*it) != '\n'))
            {
            pos++;
            it++;
            }
          }
        }

      if(ith != buffer.end())
        {
        posh++;
        ith++;
        }

      if(it != m_Buffer.end())
        {
        pos++;
        it++;
        }
      }

    if(it == m_Buffer.end())
      {
      Error error;
      error.line = 1;
      error.line2 = error.line;
      error.number = HEADER;
      error.description = "The header is incomplete";
      tempErrorVector.push_back(error);
      hasError = true;
      }

    // If we don't have any errors we return the current errors
    if(!hasError)
      {
      m_HeaderFilename = *itFilename;
      ErrorVectorType::const_iterator itErr = tempErrorVector.begin();
      while(itErr != tempErrorVector.end())
        {
        m_ErrorList.push_back(*itErr);
        itErr++;
        }
      return true;
      }

    tempErrors.push_back(tempErrorVector);

    itFilename++;
    } // end loop of filenames

  // We check the less errors we can have
  unsigned int header=0;
  int minErrors = 9999999;
  unsigned int i=0;
  std::vector<ErrorVectorType>::const_iterator itErrV = tempErrors.begin();
  while(itErrV != tempErrors.end())
    {
    if((int)(*itErrV).size() < minErrors)
      {
      header = i;
      minErrors = static_cast<int>((*itErrV).size());
      }
    i++;
    itErrV++;
    }
 
  ErrorVectorType::const_iterator itErr = tempErrors[header].begin();
  while(itErr != tempErrors[header].end())
    {
    m_ErrorList.push_back(*itErr);
    itErr++;
    }

  m_HeaderFilename = fileNames[header];
  return !hasError;
}